

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O3

void lj_dispatch_init_hotcount(global_State *g)

{
  undefined4 *puVar1;
  long lVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  
  auVar4 = ZEXT416(g[3].vmstate * 2 - 1);
  auVar4 = pshuflw(auVar4,auVar4,0);
  uVar3 = auVar4._0_4_;
  lVar2 = 0;
  do {
    puVar1 = (undefined4 *)((long)&g[5].tmpbuf.w + lVar2 * 2);
    *puVar1 = uVar3;
    puVar1[1] = uVar3;
    puVar1[2] = uVar3;
    puVar1[3] = uVar3;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x40);
  return;
}

Assistant:

void lj_dispatch_init_hotcount(global_State *g)
{
  int32_t hotloop = G2J(g)->param[JIT_P_hotloop];
  HotCount start = (HotCount)(hotloop*HOTCOUNT_LOOP - 1);
  HotCount *hotcount = G2GG(g)->hotcount;
  uint32_t i;
  for (i = 0; i < HOTCOUNT_SIZE; i++)
    hotcount[i] = start;
}